

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJSONHelpers.h
# Opt level: O3

cmJSONHelper<cm::optional<OutputOptions>_> * __thiscall
cmJSONHelperBuilder::
Optional<cmCMakePresetsGraph::TestPreset::OutputOptions,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::OutputOptions>>
          (cmJSONHelper<cm::optional<OutputOptions>_> *__return_storage_ptr__,
          cmJSONHelperBuilder *this,Object<cmCMakePresetsGraph::TestPreset::OutputOptions> *func)

{
  ObjectErrorGenerator *this_00;
  anon_class_72_1_898bcfc2 local_60;
  
  std::
  vector<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::OutputOptions>::Member,_std::allocator<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::OutputOptions>::Member>_>
  ::vector((vector<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::OutputOptions>::Member,_std::allocator<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::OutputOptions>::Member>_>
            *)&local_60,
           (vector<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::OutputOptions>::Member,_std::allocator<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::OutputOptions>::Member>_>
            *)this);
  local_60.func.AnyRequired = *(bool *)(this + 0x18);
  this_00 = &local_60.func.Error;
  std::
  function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
  ::function(this_00,(function<std::function<void_(const_Json::Value_*,_cmJSONState_*)>_(JsonErrors::ObjectError,_const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&)>
                      *)(this + 0x20));
  local_60.func.AllowExtra = *(bool *)(this + 0x40);
  std::
  function<bool(std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>&,Json::Value_const*,cmJSONState*)>
  ::
  function<cmJSONHelperBuilder::Optional<cmCMakePresetsGraph::TestPreset::OutputOptions,cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::OutputOptions>>(cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::OutputOptions>)::_lambda(std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>&,Json::Value_const*,cmJSONState*)_1_,void>
            ((function<bool(std::optional<cmCMakePresetsGraph::TestPreset::OutputOptions>&,Json::Value_const*,cmJSONState*)>
              *)__return_storage_ptr__,&local_60);
  if (local_60.func.Error.super__Function_base._M_manager != (_Manager_type)0x0) {
    (*local_60.func.Error.super__Function_base._M_manager)
              ((_Any_data *)this_00,(_Any_data *)this_00,__destroy_functor);
  }
  std::
  vector<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::OutputOptions>::Member,_std::allocator<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::OutputOptions>::Member>_>
  ::~vector((vector<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::OutputOptions>::Member,_std::allocator<cmJSONHelperBuilder::Object<cmCMakePresetsGraph::TestPreset::OutputOptions>::Member>_>
             *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

static cmJSONHelper<cm::optional<T>> Optional(F func)
  {
    return [func](cm::optional<T>& out, const Json::Value* value,
                  cmJSONState* state) -> bool {
      if (!value) {
        out.reset();
        return true;
      }
      out.emplace();
      return func(*out, value, state);
    };
  }